

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O2

void uprv_getStaticCurrencyName_63(UChar *iso,char *loc,UnicodeString *result,UErrorCode *ec)

{
  undefined8 in_RAX;
  UChar *srcChars;
  UBool isChoiceFormat;
  int32_t len;
  UBool local_15;
  int32_t local_14;
  
  local_14 = (int32_t)((ulong)in_RAX >> 0x20);
  srcChars = ucurr_getName_63(iso,loc,UCURR_SYMBOL_NAME,&local_15,&local_14,ec);
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    icu_63::UnicodeString::setTo(result,srcChars,local_14);
  }
  return;
}

Assistant:

U_CAPI void
uprv_getStaticCurrencyName(const UChar* iso, const char* loc,
                           icu::UnicodeString& result, UErrorCode& ec)
{
    U_NAMESPACE_USE

    UBool isChoiceFormat;
    int32_t len;
    const UChar* currname = ucurr_getName(iso, loc, UCURR_SYMBOL_NAME,
                                          &isChoiceFormat, &len, &ec);
    if (U_SUCCESS(ec)) {
        result.setTo(currname, len);
    }
}